

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZendParser.cpp
# Opt level: O1

void __thiscall
phpconvert::ZendParser::generatePreparedTypeFull
          (ZendParser *this,PreparedType *outPrep,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tmpVect)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  StringHelper *this_00;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar2;
  _Alloc_hider _Var3;
  size_type sVar4;
  int iVar5;
  long lVar6;
  iterator iVar7;
  long *plVar8;
  size_type *psVar9;
  string *out;
  size_type sVar10;
  string tmpString;
  stringstream stream;
  string local_218;
  key_type local_1f8;
  string local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8 [4];
  ios_base local_138 [264];
  
  lVar6 = std::__cxx11::string::find((char *)outPrep,0x1311a2,0);
  if (lVar6 == -1) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    local_1f8._M_string_length = 0;
    local_1f8.field_2._M_local_buf[0] = '\0';
    this_00 = this->stringHelper;
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"_","");
    StringHelper::split(this_00,tmpVect,&local_218,&outPrep->type);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p);
    }
    std::__cxx11::string::_M_assign((string *)&local_1f8);
    sVar4 = local_1f8._M_string_length;
    _Var3._M_p = local_1f8._M_dataplus._M_p;
    if (local_1f8._M_string_length != 0) {
      sVar10 = 0;
      do {
        iVar5 = tolower((int)_Var3._M_p[sVar10]);
        _Var3._M_p[sVar10] = (char)iVar5;
        sVar10 = sVar10 + 1;
      } while (sVar4 != sVar10);
    }
    iVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&this->keywords->_M_t,&local_1f8);
    paVar1 = &local_218.field_2;
    psVar2 = this->keywords;
    extractNamespace(this,&outPrep->type,&local_1f8,tmpVect);
    generateAlias(&local_1d8,this,&outPrep->type,
                  ((_Rb_tree_header *)iVar7._M_node != &(psVar2->_M_t)._M_impl.super__Rb_tree_header
                  ) + 1,tmpVect);
    plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_1d8,0,(char *)0x0,0x1311a2);
    psVar9 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_218.field_2._M_allocated_capacity = *psVar9;
      local_218.field_2._8_8_ = plVar8[3];
      local_218._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_218.field_2._M_allocated_capacity = *psVar9;
      local_218._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_218._M_string_length = plVar8[1];
    *plVar8 = (long)psVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_1f8,(ulong)local_218._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != paVar1) {
      operator_delete(local_218._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    out = &outPrep->alias;
    generateNamespace(this,&local_1f8,out);
    std::operator+(&local_218,"\\",out);
    std::__cxx11::string::operator=((string *)out,(string *)&local_218);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != paVar1) {
      operator_delete(local_218._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  else {
    std::operator+(local_1b8,"\\",&outPrep->type);
    std::__cxx11::string::operator=((string *)&outPrep->alias,(string *)local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8[0]._M_dataplus._M_p != &local_1b8[0].field_2) {
      operator_delete(local_1b8[0]._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void ZendParser::generatePreparedTypeFull(PreparedType &outPrep,
                                              vector<string> &tmpVect) {
        if (hasDelimeter(outPrep)) {
            outPrep.alias = NAMESPACE_SEPARATOR + outPrep.type; //extract const - ns sep.
            return;
        }

        stringstream stream;
        string tmpString;
        size_t size = 1;

        this->stringHelper->split(tmpVect, DELIMETER, outPrep.type);

        tmpString = tmpVect[tmpVect.size() - 1];
        toLower(tmpString);

        if (isKeyword(tmpString)) {
            size = 2;
        }

        extractNamespace(outPrep.type, tmpString, tmpVect);
        tmpString += DELIMETER + generateAlias(outPrep.type, size, tmpVect);
        generateNamespace(tmpString, outPrep.alias);

        outPrep.alias = NAMESPACE_SEPARATOR + outPrep.alias;
    }